

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void ConvertBGR24ToY_C(uint8_t *bgr,uint8_t *y,int width)

{
  ulong uVar1;
  ulong uVar2;
  byte *pbVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  pbVar3 = bgr + 2;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    y[uVar1] = (uint8_t)((uint)pbVar3[-2] * 0x1914 +
                         (uint)pbVar3[-1] * 0x8123 + (uint)*pbVar3 * 0x41c7 + 0x108000 >> 0x10);
    pbVar3 = pbVar3 + 3;
  }
  return;
}

Assistant:

static void ConvertBGR24ToY_C(const uint8_t* bgr, uint8_t* y, int width) {
  int i;
  for (i = 0; i < width; ++i, bgr += 3) {
    y[i] = VP8RGBToY(bgr[2], bgr[1], bgr[0], YUV_HALF);
  }
}